

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fixedEnvelopes.cpp
# Opt level: O3

void IsoSpec::reorder_array<double>(double *arr,size_t *order,size_t size,bool can_destroy)

{
  double dVar1;
  size_t sVar2;
  size_t sVar3;
  size_t *__dest;
  size_t sVar4;
  undefined7 in_register_00000009;
  
  __dest = order;
  if ((int)CONCAT71(in_register_00000009,can_destroy) == 0) {
    __dest = (size_t *)operator_new__(-(ulong)(size >> 0x3d != 0) | size * 8);
    memcpy(__dest,order,size * 8);
  }
  if (size != 0) {
    sVar4 = 0;
    do {
      sVar3 = __dest[sVar4];
      while (sVar3 != sVar4) {
        dVar1 = arr[sVar4];
        arr[sVar4] = arr[sVar3];
        arr[sVar3] = dVar1;
        sVar2 = __dest[sVar3];
        __dest[sVar3] = sVar3;
        __dest[sVar4] = sVar2;
        sVar3 = sVar2;
      }
      sVar4 = sVar4 + 1;
    } while (sVar4 != size);
  }
  if (__dest != (size_t *)0x0 && !can_destroy) {
    operator_delete__(__dest);
    return;
  }
  return;
}

Assistant:

void reorder_array(T* arr, size_t* order, size_t size, bool can_destroy = false)
{
    if(!can_destroy)
    {
        size_t* order_c = new size_t[size];
        memcpy(order_c, order, sizeof(size_t)*size);
        order = order_c;
    }

    for(size_t ii = 0; ii < size; ii++)
        while(order[ii] != ii)
        {
            std::swap(arr[ii], arr[order[ii]]);
            std::swap(order[order[ii]], order[ii]);
        }

    if(!can_destroy)
        delete[] order;
}